

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void warp_horizontal_filter
               (uint8_t *ref,__m128i *tmp,int stride,int32_t ix4,int32_t iy4,int32_t sx4,int alpha,
               int beta,int p_height,int height,int i,int offset_bits_horiz,int reduce_bits_horiz)

{
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  __m128i in_stack_00000000;
  __m128i src;
  int in_stack_00000020;
  int sx;
  int iy;
  int k;
  undefined4 local_50;
  undefined4 local_30;
  undefined4 local_2c;
  
  local_2c = -7;
  while( true ) {
    if ((int)src[1] - iy < 9) {
      local_50 = (int)src[1] - iy;
    }
    else {
      local_50 = 8;
    }
    if (local_50 <= local_2c) break;
    local_30 = in_R8D + local_2c;
    if (local_30 < 0) {
      local_30 = 0;
    }
    else if (in_stack_00000020 + -1 < local_30) {
      local_30 = in_stack_00000020 + -1;
    }
    horizontal_filter(in_stack_00000000,(__m128i *)(in_RDI + local_30 * in_EDX + (long)in_ECX + -7),
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),
                      (int)in_RSI,in_EDX);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static inline void warp_horizontal_filter(const uint8_t *ref, __m128i *tmp,
                                          int stride, int32_t ix4, int32_t iy4,
                                          int32_t sx4, int alpha, int beta,
                                          int p_height, int height, int i,
                                          const int offset_bits_horiz,
                                          const int reduce_bits_horiz) {
  int k;
  for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
    int iy = iy4 + k;
    if (iy < 0)
      iy = 0;
    else if (iy > height - 1)
      iy = height - 1;
    int sx = sx4 + beta * (k + 4);

    // Load source pixels
    const __m128i src =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    horizontal_filter(src, tmp, sx, alpha, k, offset_bits_horiz,
                      reduce_bits_horiz);
  }
}